

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

void proxy_drop(proxy_handle *ph)

{
  mutex_handle *mutex;
  void *pvVar1;
  long lVar2;
  conn_handle *conn;
  long lVar3;
  long lVar4;
  
  pvVar1 = ph->priv;
  proxy_log(ph,LOG_LEVEL_DEBUG,"Dropping all clients...\n");
  lVar3 = 0x18;
  for (lVar4 = 0; lVar4 < *(int *)((long)pvVar1 + 0x838); lVar4 = lVar4 + 1) {
    lVar2 = *(long *)((long)pvVar1 + 0x818);
    mutex = (mutex_handle *)(lVar3 + lVar2);
    mutex_lock_shared(mutex);
    conn = *(conn_handle **)(lVar2 + -0x10 + lVar3);
    if (conn != (conn_handle *)0x0) {
      conn_drop(conn);
    }
    mutex_unlock_shared(mutex);
    lVar3 = lVar3 + 0x50;
  }
  return;
}

Assistant:

void proxy_drop(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int i;

	proxy_log(ph, LOG_LEVEL_DEBUG, "Dropping all clients...\n");

	for (i = 0; i < priv->num_clients; i++)
		proxy_worker_drop(&priv->client_workers[i]);
}